

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_jsgf2fsg.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  cmd_ln_t *config_00;
  char *pcVar2;
  char *pcVar3;
  jsgf_t *grammar;
  fsg_model_t *fsg_00;
  char *local_60;
  char *outfile_1;
  char *symfile;
  char *outfile;
  char *loglevel;
  char *rule;
  cmd_ln_t *config;
  fsg_model_t *fsg;
  jsgf_t *jsgf;
  char **argv_local;
  int argc_local;
  
  config_00 = cmd_ln_parse_r((ps_config_t *)0x0,defn,argc,argv,1);
  if (config_00 == (cmd_ln_t *)0x0) {
    err_set_loglevel(ERR_INFO);
    cmd_ln_log_help_r((ps_config_t *)0x0,defn);
    argv_local._4_4_ = 1;
  }
  else {
    iVar1 = ps_config_bool(config_00,"help");
    if (iVar1 != 0) {
      usagemsg(*argv);
    }
    pcVar2 = ps_config_str(config_00,"loglevel");
    if ((pcVar2 == (char *)0x0) || (pcVar3 = err_set_loglevel_str(pcVar2), pcVar3 != (char *)0x0)) {
      pcVar2 = ps_config_str(config_00,"jsgf");
      grammar = jsgf_parse_file(pcVar2,(jsgf_t *)0x0);
      if (grammar == (jsgf_t *)0x0) {
        argv_local._4_4_ = 1;
      }
      else {
        pcVar2 = ps_config_str(config_00,"toprule");
        if (pcVar2 == (char *)0x0) {
          local_60 = (char *)0x0;
        }
        else {
          local_60 = ps_config_str(config_00,"toprule");
        }
        fsg_00 = get_fsg(grammar,local_60);
        if (fsg_00 == (fsg_model_t *)0x0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_jsgf2fsg.c"
                  ,0xaa,
                  "No fsg was built for the given rule \'%s\'.\nCheck rule name; it should be qualified (with grammar name)\nand not enclosed in angle brackets (e.g. \'grammar.rulename\')."
                  ,local_60);
          argv_local._4_4_ = 1;
        }
        else {
          iVar1 = ps_config_bool(config_00,"compile");
          if (iVar1 != 0) {
            fsg_model_null_trans_closure(fsg_00,(glist_t)0x0);
          }
          pcVar2 = ps_config_str(config_00,"fsm");
          if (pcVar2 == (char *)0x0) {
            pcVar2 = ps_config_str(config_00,"fsg");
            if (pcVar2 == (char *)0x0) {
              fsg_model_write(fsg_00,_stdout);
            }
            else {
              fsg_model_writefile(fsg_00,pcVar2);
            }
          }
          else {
            pcVar2 = ps_config_str(config_00,"fsm");
            pcVar3 = ps_config_str(config_00,"symtab");
            if (pcVar2 == (char *)0x0) {
              fsg_model_write_fsm(fsg_00,_stdout);
            }
            else {
              fsg_model_writefile_fsm(fsg_00,pcVar2);
            }
            if (pcVar3 != (char *)0x0) {
              fsg_model_writefile_symtab(fsg_00,pcVar3);
            }
          }
          fsg_model_free(fsg_00);
          jsgf_grammar_free(grammar);
          argv_local._4_4_ = 0;
        }
      }
    }
    else {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_jsgf2fsg.c"
              ,0x9b,"Invalid log level: %s\n",pcVar2);
      argv_local._4_4_ = -1;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char *argv[])
{
    jsgf_t *jsgf;
    fsg_model_t *fsg;
    cmd_ln_t *config;
    const char *rule, *loglevel;
        
    if ((config = cmd_ln_parse_r(NULL, defn, argc, argv, TRUE)) == NULL) {
        /* This probably just means that we got no arguments. */
        err_set_loglevel(ERR_INFO);
        cmd_ln_log_help_r(NULL, defn);
        return 1;
    }

    if (ps_config_bool(config, "help")) {
        usagemsg(argv[0]);
    }

    loglevel = ps_config_str(config, "loglevel");
    if (loglevel) {
        if (err_set_loglevel_str(loglevel) == NULL) {
            E_ERROR("Invalid log level: %s\n", loglevel);
            return -1;
        }
    }

    jsgf = jsgf_parse_file(ps_config_str(config, "jsgf"), NULL);
    if (jsgf == NULL) {
        return 1;
    }

    rule = ps_config_str(config, "toprule") ? ps_config_str(config, "toprule") : NULL;
    if (!(fsg = get_fsg(jsgf, rule))) {
        E_ERROR("No fsg was built for the given rule '%s'.\n"
                "Check rule name; it should be qualified (with grammar name)\n"
                "and not enclosed in angle brackets (e.g. 'grammar.rulename').",
                rule);
        return 1;
    }


    if (ps_config_bool(config, "compile")) {
	fsg_model_null_trans_closure(fsg, NULL);
    }

    
    if (ps_config_str(config, "fsm")) {
	const char* outfile = ps_config_str(config, "fsm");
	const char* symfile = ps_config_str(config, "symtab");
        if (outfile)
            fsg_model_writefile_fsm(fsg, outfile);
        else
            fsg_model_write_fsm(fsg, stdout);
        if (symfile)
            fsg_model_writefile_symtab(fsg, symfile);
    }
    else {
        const char *outfile = ps_config_str(config, "fsg");
        if (outfile)
            fsg_model_writefile(fsg, outfile);
        else
            fsg_model_write(fsg, stdout);
    }
    fsg_model_free(fsg);
    jsgf_grammar_free(jsgf);

    return 0;
}